

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::Mesh::Reset(Mesh *this)

{
  Skeleton *this_00;
  VertexData *this_01;
  pointer ppSVar1;
  SubMesh *this_02;
  pointer ppAVar2;
  Animation *this_03;
  pointer ppPVar3;
  Pose *this_04;
  Animation **anim;
  pointer ppAVar4;
  pointer ppPVar5;
  SubMesh **mesh;
  pointer ppSVar6;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
  }
  operator_delete(this_00,0x38);
  this->skeleton = (Skeleton *)0x0;
  this_01 = this->sharedVertexData;
  if (this_01 != (VertexData *)0x0) {
    VertexData::~VertexData(this_01);
  }
  operator_delete(this_01,200);
  this->sharedVertexData = (VertexData *)0x0;
  ppSVar1 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar6 = (this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar1;
      ppSVar6 = ppSVar6 + 1) {
    this_02 = *ppSVar6;
    if (this_02 != (SubMesh *)0x0) {
      SubMesh::~SubMesh(this_02);
    }
    operator_delete(this_02,0xa8);
    *ppSVar6 = (SubMesh *)0x0;
  }
  ppSVar6 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->subMeshes).
      super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar6) {
    (this->subMeshes).
    super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar6;
  }
  ppAVar2 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar4 = (this->animations).
                 super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar4 != ppAVar2;
      ppAVar4 = ppAVar4 + 1) {
    this_03 = *ppAVar4;
    if (this_03 != (Animation *)0x0) {
      Animation::~Animation(this_03);
    }
    operator_delete(this_03,0x70);
    *ppAVar4 = (Animation *)0x0;
  }
  ppAVar4 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->animations).
      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar4) {
    (this->animations).
    super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar4;
  }
  ppPVar3 = (this->poses).
            super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar5 = (this->poses).
                 super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar5 != ppPVar3; ppPVar5 = ppPVar5 + 1
      ) {
    this_04 = *ppPVar5;
    if (this_04 != (Pose *)0x0) {
      Pose::~Pose(this_04);
    }
    operator_delete(this_04,0x58);
    *ppPVar5 = (Pose *)0x0;
  }
  ppPVar5 = (this->poses).
            super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar5) {
    (this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar5;
  }
  return;
}

Assistant:

void Mesh::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
    for(auto &pose : poses) {
        OGRE_SAFE_DELETE(pose)
    }
    poses.clear();
}